

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

Api RtAudio::getCompiledApiByName(string *name)

{
  Api AVar1;
  bool bVar2;
  int iVar3;
  Api AVar4;
  long lVar5;
  bool bVar6;
  
  bVar6 = false;
  lVar5 = 0;
  do {
    AVar1 = rtaudio_compiled_apis[lVar5];
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) break;
    lVar5 = 1;
    bVar2 = !bVar6;
    bVar6 = true;
  } while (bVar2);
  AVar4 = UNSPECIFIED;
  if (iVar3 == 0) {
    AVar4 = AVar1;
  }
  return AVar4;
}

Assistant:

RtAudio::Api RtAudio :: getCompiledApiByName( const std::string &name )
{
  unsigned int i=0;
  for (i = 0; i < rtaudio_num_compiled_apis; ++i)
    if (name == rtaudio_api_names[rtaudio_compiled_apis[i]][0])
      return rtaudio_compiled_apis[i];
  return RtAudio::UNSPECIFIED;
}